

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qprintpreviewdialog.cpp
# Opt level: O3

void QPrintPreviewDialog::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QPrintPreviewDialogPrivate *this;
  undefined8 *puVar1;
  long in_FS_OFFSET;
  undefined8 local_30;
  void *local_28;
  undefined8 *local_20;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    if (((_id == 1) || (_id == 4)) || (_id == 5)) {
      puVar1 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar1 = &QtPrivate::QMetaTypeInterfaceWrapper<QAction_*>::metaType;
        goto switchD_0014b562_default;
      }
    }
    else {
      puVar1 = (undefined8 *)*_a;
    }
    *puVar1 = 0;
    goto switchD_0014b562_default;
  }
  if (_c == IndexOfMethod) {
    if ((*_a[1] == paintRequested) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
    goto switchD_0014b562_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_0014b562_default;
  switch(_id) {
  case 0:
    local_30 = *_a[1];
    local_20 = &local_30;
    local_28 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,0,&local_28);
  default:
switchD_0014b562_default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return;
    }
    break;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QPrintPreviewDialogPrivate::_q_fit(*(QPrintPreviewDialogPrivate **)(_o + 8),*_a[1]);
      return;
    }
    break;
  case 2:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QPrintPreviewDialogPrivate::_q_zoomIn(*(QPrintPreviewDialogPrivate **)(_o + 8));
      return;
    }
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QPrintPreviewDialogPrivate::_q_zoomOut(*(QPrintPreviewDialogPrivate **)(_o + 8));
      return;
    }
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QPrintPreviewDialogPrivate::_q_navigate(*(QPrintPreviewDialogPrivate **)(_o + 8),*_a[1]);
      return;
    }
    break;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QPrintPreviewDialogPrivate::_q_setMode(*(QPrintPreviewDialogPrivate **)(_o + 8),*_a[1]);
      return;
    }
    break;
  case 6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QPrintPreviewDialogPrivate::_q_pageNumEdited(*(QPrintPreviewDialogPrivate **)(_o + 8));
      return;
    }
    break;
  case 7:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QPrintPreviewDialogPrivate::_q_print(*(QPrintPreviewDialogPrivate **)(_o + 8));
      return;
    }
    break;
  case 8:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QPrintPreviewDialogPrivate::_q_pageSetup(*(QPrintPreviewDialogPrivate **)(_o + 8));
      return;
    }
    break;
  case 9:
    this = *(QPrintPreviewDialogPrivate **)(_o + 8);
    QPrintPreviewDialogPrivate::updateNavActions(this);
    QPrintPreviewDialogPrivate::updatePageNumLabel(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QPrintPreviewDialogPrivate::updateZoomFactor(this);
      return;
    }
    break;
  case 10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      QPrintPreviewDialogPrivate::_q_zoomFactorChanged(*(QPrintPreviewDialogPrivate **)(_o + 8));
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QPrintPreviewDialog::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QPrintPreviewDialog *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->paintRequested((*reinterpret_cast< std::add_pointer_t<QPrinter*>>(_a[1]))); break;
        case 1: _t->d_func()->_q_fit((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 2: _t->d_func()->_q_zoomIn(); break;
        case 3: _t->d_func()->_q_zoomOut(); break;
        case 4: _t->d_func()->_q_navigate((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 5: _t->d_func()->_q_setMode((*reinterpret_cast< std::add_pointer_t<QAction*>>(_a[1]))); break;
        case 6: _t->d_func()->_q_pageNumEdited(); break;
        case 7: _t->d_func()->_q_print(); break;
        case 8: _t->d_func()->_q_pageSetup(); break;
        case 9: _t->d_func()->_q_previewChanged(); break;
        case 10: _t->d_func()->_q_zoomFactorChanged(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAction* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QPrintPreviewDialog::*)(QPrinter * )>(_a, &QPrintPreviewDialog::paintRequested, 0))
            return;
    }
}